

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall cpptempl::TokenIf::gettext(TokenIf *this,ostream *stream,data_map *data)

{
  pointer pcVar1;
  long *plVar2;
  bool bVar3;
  pointer psVar4;
  long lVar5;
  ulong uVar6;
  string local_50;
  
  pcVar1 = (this->m_expr)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->m_expr)._M_string_length);
  bVar3 = is_true(this,&local_50,data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((bVar3) &&
     (psVar4 = (this->m_children).
               super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->m_children).
     super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar4)) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      plVar2 = *(long **)((long)&(psVar4->
                                 super___shared_ptr<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar5);
      (**(code **)(*plVar2 + 8))(plVar2,stream,data);
      uVar6 = uVar6 + 1;
      psVar4 = (this->m_children).
               super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->m_children).
                                   super__Vector_base<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4));
  }
  return;
}

Assistant:

inline void TokenIf::gettext( std::ostream &stream, data_map &data )
    {
        if (is_true(m_expr, data))
        {
            for(size_t j = 0 ; j < m_children.size() ; ++j)
            {
                m_children[j]->gettext(stream, data) ;
            }
        }
    }